

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cc
# Opt level: O3

result_type_conflict
time_plain<boost::random::inversive_congruential_engine<unsigned_int,9102u,2110599482u,2147483647u>>
          (inversive_congruential_engine<unsigned_int,_9102U,_2110599482U,_2147483647U> *r)

{
  undefined1 auVar1 [16];
  int iVar2;
  uint uVar3;
  long lVar4;
  ulong uVar5;
  result_type_conflict rVar6;
  long lVar7;
  string res;
  string local_50;
  double local_30;
  
  lVar4 = std::chrono::_V2::system_clock::now();
  uVar3 = r->_value;
  rVar6 = 0;
  lVar7 = 0x1000000;
  do {
    uVar3 = boost::random::const_mod<unsigned_int,_2147483647U>::invert(uVar3);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = (ulong)uVar3 * 0x238e;
    uVar5 = (ulong)(SUB164(auVar1 * ZEXT816(0x400000008001),8) >> 0xd) * -0x7fffffff +
            (ulong)uVar3 * 0x238e;
    iVar2 = (int)uVar5;
    uVar3 = iVar2 + 0x7dcd313a;
    if (0x232cec4 < uVar5) {
      uVar3 = iVar2 + 0xfdcd313b;
    }
    r->_value = uVar3;
    rVar6 = rVar6 + uVar3;
    lVar7 = lVar7 + -1;
  } while (lVar7 != 0);
  lVar7 = std::chrono::_V2::system_clock::now();
  local_30 = 16.777216 / ((double)((lVar7 - lVar4) / 1000) * 1e-06);
  to_string<double>(&local_50,&local_30);
  while (local_50._M_string_length < 10) {
    std::__cxx11::string::push_back((char)&local_50);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,local_50._M_dataplus._M_p,local_50._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return rVar6;
}

Assistant:

typename R::result_type time_plain(R &r) {
  typename R::result_type s{0};
  timer T;
  long max(1l << 24);
  for (long i{0}; i < max; ++i)
    s += r();
  std::string res(to_string(1e-6 * max / T.time()));
  while (res.length() < 10)
    res += ' ';
  std::cout << res;
  return s;
}